

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalValueDatabase.cpp
# Opt level: O0

void __thiscall OptimalValueDatabase::Save(OptimalValueDatabase *this)

{
  byte bVar1;
  char *pcVar2;
  E *this_00;
  ostream *poVar3;
  long in_RDI;
  stringstream ss;
  ofstream fp;
  string *in_stack_fffffffffffffbe8;
  string local_3e8 [39];
  undefined1 local_3c1;
  stringstream local_3a0 [16];
  ostream local_390 [392];
  long local_208 [16];
  OptimalValueDatabase *in_stack_fffffffffffffe78;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_208 + *(long *)(local_208[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ios_base::precision((ios_base *)((long)local_208 + *(long *)(local_208[0] + -0x18)),0x10);
    poVar3 = std::operator<<((ostream *)local_208,"problem discount horizon value");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    SoftPrint_abi_cxx11_(in_stack_fffffffffffffe78);
    std::operator<<((ostream *)local_208,local_3e8);
    std::__cxx11::string::~string(local_3e8);
    std::ofstream::~ofstream(local_208);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3a0);
  poVar3 = std::operator<<(local_390,"OptimalValueDatabase::Save() failed to open file ");
  poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x30));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_3c1 = 1;
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  E::E(this_00,in_stack_fffffffffffffbe8);
  local_3c1 = 0;
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void OptimalValueDatabase::Save() const
{
    ofstream fp(_filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "OptimalValueDatabase::Save() failed to open file "
           << _filename << endl;
        throw E(ss.str());
    }

    fp.precision(16);
    
    fp << "problem discount horizon value" << endl;
    fp << SoftPrint();
}